

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O2

RTCDevice rtcNewDevice(char *config)

{
  int iVar1;
  Device *this;
  undefined4 extraout_var;
  Lock<embree::MutexSys> lock;
  
  lock.mutex = &g_mutex;
  lock.locked = true;
  embree::MutexSys::lock(&g_mutex);
  this = (Device *)embree::Device::operator_new(0x570);
  embree::Device::Device(this,config);
  iVar1 = (*(this->super_State).super_RefCount._vptr_RefCount[2])(this);
  embree::Lock<embree::MutexSys>::~Lock(&lock);
  return (RTCDevice)CONCAT44(extraout_var,iVar1);
}

Assistant:

RTC_API RTCDevice rtcNewDevice(const char* config)
  {
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcNewDevice);
    Lock<MutexSys> lock(g_mutex);
    Device* device = new Device(config);
    return (RTCDevice) device->refInc();
    RTC_CATCH_END(nullptr);
    return (RTCDevice) nullptr;
  }